

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curramt.cpp
# Opt level: O0

void __thiscall
icu_63::CurrencyAmount::CurrencyAmount
          (CurrencyAmount *this,double amount,ConstChar16Ptr *isoCode,UErrorCode *ec)

{
  MeasureUnit *this_00;
  ConstChar16Ptr *size;
  MeasureUnit *local_c8;
  ConstChar16Ptr local_a8;
  undefined1 local_99;
  Formattable local_98;
  UErrorCode *local_28;
  UErrorCode *ec_local;
  ConstChar16Ptr *isoCode_local;
  double amount_local;
  CurrencyAmount *this_local;
  
  size = isoCode;
  local_28 = ec;
  ec_local = (UErrorCode *)isoCode;
  isoCode_local = (ConstChar16Ptr *)amount;
  amount_local = (double)this;
  Formattable::Formattable(&local_98,amount);
  this_00 = (MeasureUnit *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
  local_c8 = (MeasureUnit *)0x0;
  if (this_00 != (MeasureUnit *)0x0) {
    local_99 = 1;
    local_a8 = (ConstChar16Ptr)isoCode->p_;
    CurrencyUnit::CurrencyUnit((CurrencyUnit *)this_00,&local_a8,local_28);
    local_c8 = this_00;
  }
  local_99 = 0;
  Measure::Measure(&this->super_Measure,&local_98,local_c8,local_28);
  if (this_00 != (MeasureUnit *)0x0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
  }
  Formattable::~Formattable(&local_98);
  (this->super_Measure).super_UObject._vptr_UObject = (_func_int **)&PTR__CurrencyAmount_004f1668;
  return;
}

Assistant:

CurrencyAmount::CurrencyAmount(double amount, ConstChar16Ptr isoCode,
                               UErrorCode& ec) :
    Measure(Formattable(amount), new CurrencyUnit(isoCode, ec), ec) {
}